

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O0

void __thiscall
JFSON::Value<(JFSON::Json::Type)4,_std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>_>::dump
          (Value<(JFSON::Json::Type)4,_std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>_>
           *this,string *out)

{
  string *out_local;
  Value<(JFSON::Json::Type)4,_std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>_> *this_local;
  
  JFSON::dump(&this->m_value,out);
  return;
}

Assistant:

void dump(string &out) const override { JFSON::dump(m_value, out); }